

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::image_display::on_mouse_up
          (image_display *this,unsigned_long btn,unsigned_long state,long x,long y)

{
  long lVar1;
  _Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false> _Var2;
  rectangle *prVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  rectangle new_rect;
  rectangle local_d0;
  overlay_rect local_b0;
  
  scrollable_region::on_mouse_up(&this->super_scrollable_region,btn,state,x,y);
  if ((state & 8) == 0) {
    if (this->holding_shift_key == true) {
      this->holding_shift_key = false;
      base_window::invalidate_rectangle
                (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
                 &(this->super_scrollable_region).super_drawable.rect);
    }
    goto LAB_00275eeb;
  }
  this->holding_shift_key = true;
  if ((((btn != 1) || (this->drawing_rect == false)) ||
      ((this->super_scrollable_region).super_drawable.hidden != false)) ||
     ((this->super_scrollable_region).super_drawable.enabled != true)) goto LAB_00275eeb;
  prVar3 = scrollable_region::total_rect(&this->super_scrollable_region);
  lVar6 = x - prVar3->l;
  lVar7 = y - prVar3->t;
  lVar1 = this->zoom_in_scale;
  lVar5 = (this->rect_anchor).
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[0] - prVar3->l;
  lVar4 = (this->rect_anchor).
          super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[1] - prVar3->t;
  if (lVar1 == 1) {
    if (this->zoom_out_scale != 1) {
      dVar11 = (double)this->zoom_out_scale;
      dVar8 = floor((double)lVar6 * dVar11 + 0.5);
      dVar9 = floor((double)lVar7 * dVar11 + 0.5);
      dVar10 = (double)lVar5 * dVar11;
      dVar11 = (double)lVar4 * dVar11;
      goto LAB_0027607a;
    }
  }
  else {
    dVar11 = (double)lVar1;
    dVar8 = floor((double)lVar6 / dVar11 + 0.5);
    dVar9 = floor((double)lVar7 / dVar11 + 0.5);
    dVar10 = (double)lVar5 / dVar11;
    dVar11 = (double)lVar4 / dVar11;
LAB_0027607a:
    lVar7 = (long)dVar9;
    lVar6 = (long)dVar8;
    dVar8 = floor(dVar10 + 0.5);
    lVar5 = (long)dVar8;
    dVar8 = floor(dVar11 + 0.5);
    lVar4 = (long)dVar8;
  }
  local_d0.l = lVar6;
  if (lVar5 < lVar6) {
    local_d0.l = lVar5;
  }
  local_d0.t = lVar7;
  if (lVar4 < lVar7) {
    local_d0.t = lVar4;
  }
  local_d0.r = lVar5;
  if (lVar5 < lVar6) {
    local_d0.r = lVar6;
  }
  local_d0.b = lVar4;
  if (lVar4 < lVar7) {
    local_d0.b = lVar7;
  }
  if (lVar1 != 1) {
    local_d0.r = local_d0.r + -1;
    local_d0.b = local_d0.b + -1;
  }
  if (((local_d0.b - local_d0.t != -1) && (local_d0.t <= local_d0.b)) &&
     ((local_d0.l <= local_d0.r && (local_d0.r - local_d0.l != -1)))) {
    overlay_rect::overlay_rect<dlib::rgb_alpha_pixel>
              (&local_b0,&local_d0,this->default_rect_color,&this->default_rect_label);
    add_overlay(this,&local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
    ::~_Rb_tree(&local_b0.parts._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.label._M_dataplus._M_p != &local_b0.label.field_2) {
      operator_delete(local_b0.label._M_dataplus._M_p);
    }
    _Var2._M_head_impl =
         (this->event_handler).data._M_t.
         super___uniq_ptr_impl<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_std::default_delete<dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_>_>
         .super__Head_base<0UL,_dlib::any_function<void_(),_void,_0UL>::Tbase<void_()>_*,_false>.
         _M_head_impl;
    if (_Var2._M_head_impl != (Tbase<void_()> *)0x0) {
      (*(_Var2._M_head_impl)->_vptr_Tbase[2])();
    }
  }
LAB_00275eeb:
  if (this->drawing_rect == true) {
    this->drawing_rect = false;
    base_window::invalidate_rectangle
              (&((this->super_scrollable_region).super_drawable.parent)->super_base_window,
               &(this->super_scrollable_region).super_drawable.rect);
  }
  if (this->moving_overlay == true) {
    this->moving_overlay = false;
  }
  return;
}

Assistant:

void image_display::
    on_mouse_up (
        unsigned long btn,
        unsigned long state,
        long x,
        long y
    )
    {
        scrollable_region::on_mouse_up(btn,state,x,y);

        if (state&base_window::SHIFT)
        {
            holding_shift_key = true;
        }
        else if (holding_shift_key)
        {
            holding_shift_key = false;
            parent.invalidate_rectangle(rect);
        }

        if (drawing_rect && btn == base_window::LEFT && (state&base_window::SHIFT) &&
            !hidden && enabled)
        {
            const point origin(total_rect().tl_corner());
            point c1 = point(x,y) - origin;
            point c2 = rect_anchor - origin;

            if (zoom_in_scale != 1)
            {
                c1 = c1/(double)zoom_in_scale;
                c2 = c2/(double)zoom_in_scale;
            }
            else if (zoom_out_scale != 1)
            {
                c1 = c1*(double)zoom_out_scale;
                c2 = c2*(double)zoom_out_scale;
            }

            rectangle new_rect(c1,c2);
            if (zoom_in_scale != 1)
            {
                // When we are zoomed in we adjust the rectangles a little so they
                // are drown surrounding the pixels inside the rect.  This adjustment
                // is necessary to make this code consistent with this goal.
                new_rect.right() -= 1;
                new_rect.bottom() -= 1;
            }


            if (new_rect.width() > 0 && new_rect.height() > 0)
            {
                add_overlay(overlay_rect(new_rect, default_rect_color, default_rect_label));

                if (event_handler.is_set())
                    event_handler();
            }
        }

        if (drawing_rect)
        {
            drawing_rect = false;
            parent.invalidate_rectangle(rect);
        }
        if (moving_overlay)
        {
            moving_overlay = false;
        }
    }